

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

void __thiscall VFS::CVFS::CVFSDir::InternalAppendChild(CVFSDir *this,VFSNode *Child)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  __shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
  local_88;
  __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
  local_80;
  const_iterator local_78;
  string local_60;
  string local_40;
  ulong local_20;
  size_t Pos;
  VFSNode *Child_local;
  CVFSDir *this_local;
  
  Pos = (size_t)Child;
  Child_local = (VFSNode *)this;
  for (local_20 = 0; uVar1 = local_20,
      sVar3 = std::
              vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
              ::size(&this->m_Childs), uVar1 < sVar3; local_20 = local_20 + 1) {
    peVar4 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)Child);
    CVFSNode::Name_abi_cxx11_(&local_40,peVar4);
    this_00 = (__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
              ::operator[](&this->m_Childs,local_20);
    peVar4 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    CVFSNode::Name_abi_cxx11_(&local_60,peVar4);
    bVar2 = std::operator<(&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar2) break;
  }
  local_88._M_current =
       (shared_ptr<VFS::CVFSNode> *)
       std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
       ::begin(&this->m_Childs);
  local_80 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
             ::operator+(&local_88,local_20);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<VFS::CVFSNode>const*,std::vector<std::shared_ptr<VFS::CVFSNode>,std::allocator<std::shared_ptr<VFS::CVFSNode>>>>
  ::__normal_iterator<std::shared_ptr<VFS::CVFSNode>*>
            ((__normal_iterator<std::shared_ptr<VFS::CVFSNode>const*,std::vector<std::shared_ptr<VFS::CVFSNode>,std::allocator<std::shared_ptr<VFS::CVFSNode>>>>
              *)&local_78,&local_80);
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  insert(&this->m_Childs,local_78,Child);
  return;
}

Assistant:

void InternalAppendChild(VFSNode Child)
                    {
                        size_t Pos = 0;

                        //Sorts the data ascending.
                        for (Pos = 0; Pos < m_Childs.size(); Pos++)
                        {
                            if(Child->Name() < m_Childs[Pos]->Name())
                                break;
                        }
                        
                        m_Childs.insert(m_Childs.begin() + Pos, Child);
                    }